

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_NodeCutFindOrAdd(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  Ivy_Cut_t *pIVar1;
  short sVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  
  if (pCutNew->uHash == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0x2ac,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  iVar3 = pCutStore->nCuts;
  lVar7 = (long)iVar3;
  if (0 < lVar7) {
    piVar8 = pCutStore->pCuts[0].pArray;
    lVar9 = 0;
    do {
      if (pCutStore->pCuts[lVar9].uHash == pCutNew->uHash) {
        sVar2 = pCutStore->pCuts[lVar9].nSize;
        if (sVar2 == pCutNew->nSize) {
          if (sVar2 < 1) {
            uVar10 = 0;
          }
          else {
            uVar10 = 0;
            while (piVar8[uVar10] == pCutNew->pArray[uVar10]) {
              uVar10 = uVar10 + 1;
              if ((uint)(int)sVar2 == uVar10) {
                return 1;
              }
            }
          }
          if ((uint)uVar10 == (int)sVar2) {
            return 1;
          }
        }
      }
      lVar9 = lVar9 + 1;
      piVar8 = piVar8 + 9;
    } while (lVar9 != lVar7);
  }
  if (pCutStore->nCutsMax <= iVar3) {
    __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCut.c"
                  ,0x2ba,"int Ivy_NodeCutFindOrAdd(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  pCutStore->nCuts = iVar3 + 1;
  pCutStore->pCuts[lVar7].uHash = pCutNew->uHash;
  iVar3 = pCutNew->nLatches;
  sVar2 = pCutNew->nSize;
  sVar6 = pCutNew->nSizeMax;
  uVar4 = *(undefined8 *)pCutNew->pArray;
  uVar5 = *(undefined8 *)(pCutNew->pArray + 4);
  piVar8 = pCutStore->pCuts[lVar7].pArray;
  *(undefined8 *)(piVar8 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
  *(undefined8 *)(piVar8 + 4) = uVar5;
  pIVar1 = pCutStore->pCuts + lVar7;
  pIVar1->nLatches = iVar3;
  pIVar1->nSize = sVar2;
  pIVar1->nSizeMax = sVar6;
  *(undefined8 *)pIVar1->pArray = uVar4;
  return 0;
}

Assistant:

int Ivy_NodeCutFindOrAdd( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->uHash == pCutNew->uHash && pCut->nSize == pCutNew->nSize )
        {
            for ( k = 0; k < pCutNew->nSize; k++ )
                if ( pCut->pArray[k] != pCutNew->pArray[k] )
                    break;
            if ( k == pCutNew->nSize )
                return 1;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}